

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::RandomWalkIntegrator::LiRandomWalk
          (RandomWalkIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,int depth)

{
  Vector3f *this_00;
  pointer pLVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  ShapeIntersection *this_01;
  pointer pLVar9;
  type a;
  undefined1 auVar10 [64];
  undefined1 auVar19 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar28 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  Vector3<float> VVar29;
  Vector3f VVar30;
  anon_class_16_2_2793a994 func;
  SampledSpectrum SVar31;
  SampledSpectrum beta;
  Point2f u;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  SampledSpectrum local_2c8;
  undefined1 local_2b8 [16];
  float local_29c;
  Tuple3<pbrt::Vector3,_float> local_298;
  SampledSpectrum local_288;
  undefined1 local_278 [16];
  TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_268;
  SampledSpectrum local_260;
  Tuple2<pbrt::Point2,_float> local_250;
  uintptr_t local_248;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_240;
  RayDifferential local_238;
  BSDF local_1d8;
  optional<pbrt::ShapeIntersection> local_1a0;
  RayDifferential local_98;
  undefined1 auVar11 [64];
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  
  local_2b8._8_8_ = local_2b8._0_8_;
  SampledSpectrum::SampledSpectrum(&local_2c8,0.0);
  auVar10 = ZEXT464(0x7f800000);
  Integrator::Intersect(&local_1a0,(Integrator *)this,&ray->super_Ray,INFINITY);
  auVar28 = in_ZMM1._8_56_;
  auVar19 = auVar10._8_56_;
  if (local_1a0.set == false) {
    pLVar9 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.infiniteLights.
             super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar1 = *(pointer *)
              ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                      infiniteLights.
                      super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                      _M_impl.super__Vector_impl_data + 8);
    while( true ) {
      auVar28 = in_ZMM1._8_56_;
      auVar19 = auVar10._8_56_;
      if (pLVar9 == pLVar1) break;
      local_1d8.bxdf.
      super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
      .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
               )(pLVar9->
                super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                ).bits;
      func.lambda = lambda;
      func.ray = &ray->super_Ray;
      SVar31 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
               ::
               Dispatch<pbrt::LightHandle::Le(pbrt::Ray_const&,pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                         ((TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
                           *)&local_1d8,func);
      in_ZMM1._0_8_ = SVar31.values.values._8_8_;
      in_ZMM1._8_56_ = auVar28;
      auVar10._0_8_ = SVar31.values.values._0_8_;
      auVar10._8_56_ = auVar19;
      auVar20 = vmovlhps_avx(auVar10._0_16_,in_ZMM1._0_16_);
      auVar10 = ZEXT1664(auVar20);
      local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar20._0_8_;
      local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar20._8_4_;
      local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar20._12_4_;
      SampledSpectrum::operator+=(&local_2c8,(SampledSpectrum *)&local_238);
      pLVar9 = pLVar9 + 1;
    }
  }
  else {
    local_2b8._0_8_ = scratchBuffer;
    this_01 = pstd::optional<pbrt::ShapeIntersection>::value(&local_1a0);
    this_00 = &(ray->super_Ray).d;
    VVar29 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>);
    SVar31 = SurfaceInteraction::Le
                       (&this_01->intr,(Vector3f)VVar29.super_Tuple3<pbrt::Vector3,_float>,lambda);
    auVar21._0_8_ = SVar31.values.values._8_8_;
    auVar21._8_56_ = auVar28;
    auVar11._0_8_ = SVar31.values.values._0_8_;
    auVar11._8_56_ = auVar19;
    auVar20 = auVar21._0_16_;
    local_2c8.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar20);
    SVar31.values.values = local_2c8.values.values;
    if (this->maxDepth == depth) goto LAB_003eb9f1;
    local_240.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_248 = (sampler->
                super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
    SurfaceInteraction::GetBSDF
              (&local_1d8,&this_01->intr,ray,lambda,(CameraHandle *)&local_240,
               (ScratchBuffer *)local_2b8._0_8_,(SamplerHandle)&local_248);
    if (((ulong)local_1d8.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
                .bits & 0xffffffffffff) != 0) {
      auVar12._0_8_ =
           TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
           ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                     ((TaggedPointer<pbrt::RandomSampler,pbrt::StratifiedSampler,pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::SobolSampler,pbrt::ZSobolSampler,pbrt::PMJ02BNSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                       *)sampler);
      auVar12._8_56_ = extraout_var;
      local_250 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar12._0_16_);
      auVar19 = extraout_var;
      VVar30 = SampleUniformSphere((Point2f *)&local_250);
      local_29c = VVar30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar13._0_8_ = VVar30.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar19;
      local_278 = auVar13._0_16_;
      local_298._0_8_ = vmovlps_avx(local_278);
      local_298.z = local_29c;
      VVar29 = Tuple3<pbrt::Vector3,_float>::operator-(&this_00->super_Tuple3<pbrt::Vector3,_float>)
      ;
      auVar20 = local_278;
      VVar30.super_Tuple3<pbrt::Vector3,_float>.z = local_29c;
      VVar30.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_278._0_4_;
      VVar30.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_278._4_4_;
      local_278 = auVar20;
      SVar31 = BSDF::f(&local_1d8,(Vector3f)VVar29.super_Tuple3<pbrt::Vector3,_float>,VVar30,
                       Radiance);
      auVar22._0_8_ = SVar31.values.values._8_8_;
      auVar22._8_56_ = auVar28;
      auVar14._0_8_ = SVar31.values.values._0_8_;
      auVar14._8_56_ = auVar19;
      auVar11._0_8_ = local_2b8._0_8_;
      local_288.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar22._0_16_);
      a = AbsDot<float>((Vector3<float> *)&local_298,&(this_01->intr).shading.n);
      auVar19 = extraout_var_00;
      SVar31 = SampledSpectrum::operator*(&local_288,a);
      auVar23._0_8_ = SVar31.values.values._8_8_;
      auVar23._8_56_ = auVar28;
      auVar15._0_8_ = SVar31.values.values._0_8_;
      auVar15._8_56_ = auVar19;
      auVar20 = vmovlhps_avx(auVar15._0_16_,auVar23._0_16_);
      local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar20._0_8_;
      local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar20._8_4_;
      local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar20._12_4_;
      auVar19 = (undefined1  [56])0x0;
      SVar31 = SampledSpectrum::operator/((SampledSpectrum *)&local_238,0.07957747);
      auVar24._0_8_ = SVar31.values.values._8_8_;
      auVar24._8_56_ = auVar28;
      auVar16._0_8_ = SVar31.values.values._0_8_;
      auVar16._8_56_ = auVar19;
      local_260.values.values = (array<float,_4>)vmovlhps_avx(auVar16._0_16_,auVar24._0_16_);
      bVar8 = SampledSpectrum::operator_cast_to_bool(&local_260);
      if (bVar8) {
        Interaction::SpawnRay(&local_238,(Interaction *)this_01,(Vector3f *)&local_298);
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x =
             local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
             local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
        *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_238.super_Ray._20_8_;
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x =
             local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y =
             local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
        *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x,
                      local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z);
        (ray->super_Ray).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (uintptr_t)
                local_238.super_Ray.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
             local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
             local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
             local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x;
        (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
             local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y;
        *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z = local_238._76_8_;
        (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
             local_238.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y;
        (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z =
             local_238.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z;
        ray->hasDifferentials = local_238.hasDifferentials;
        *(undefined3 *)&ray->field_0x29 = local_238._41_3_;
        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x =
             local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
             local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
        (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z =
             local_238.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x =
             local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
             local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y;
        *(ulong *)&(ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(local_238.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x,
                      local_238.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z);
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
             (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
             (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar6 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar7 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        local_98.super_Ray._20_8_ =
             *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z =
             (float)*(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
        local_98.super_Ray.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = local_238.super_Ray.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_98.hasDifferentials = ray->hasDifferentials;
        local_98._41_3_ = *(undefined3 *)&ray->field_0x29;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x =
             (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
             (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        uVar2 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x;
        uVar3 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y;
        uVar4 = (ray->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z;
        uVar5._0_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
        uVar5._4_4_ = (ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
        local_98._76_8_ = *(undefined8 *)&(ray->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y =
             (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z =
             (ray->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
        local_268.bits =
             (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        auVar19 = ZEXT856((ulong)local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_);
        auVar28 = ZEXT856(uVar5);
        local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar6;
        local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar7;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar2;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y = (float)uVar3;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = (float)uVar4;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = (float)(undefined4)uVar5;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar5._4_4_;
        SVar31 = LiRandomWalk(this,&local_98,lambda,(SamplerHandle *)&local_268,
                              (ScratchBuffer *)auVar11._0_8_,depth + 1);
        auVar25._0_8_ = SVar31.values.values._8_8_;
        auVar25._8_56_ = auVar28;
        auVar17._0_8_ = SVar31.values.values._0_8_;
        auVar17._8_56_ = auVar19;
        local_288.values.values = (array<float,_4>)vmovlhps_avx(auVar17._0_16_,auVar25._0_16_);
        auVar19 = ZEXT856(local_288.values.values._8_8_);
        SVar31 = SampledSpectrum::operator*(&local_260,&local_288);
        auVar26._0_8_ = SVar31.values.values._8_8_;
        auVar26._8_56_ = auVar28;
        auVar18._0_8_ = SVar31.values.values._0_8_;
        auVar18._8_56_ = auVar19;
        auVar20 = vmovlhps_avx(auVar18._0_16_,auVar26._0_16_);
        local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = auVar20._0_8_;
        local_238.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.z = auVar20._8_4_;
        local_238.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar20._12_4_;
        SVar31 = SampledSpectrum::operator+(&local_2c8,(SampledSpectrum *)&local_238);
        auVar27._0_8_ = SVar31.values.values._8_8_;
        auVar27._8_56_ = auVar28;
        auVar20 = auVar27._0_16_;
        auVar11._0_8_ = SVar31.values.values._0_8_;
        SVar31.values.values = local_2c8.values.values;
        goto LAB_003eb9f1;
      }
    }
  }
  SVar31.values.values = local_2c8.values.values;
  auVar20._8_8_ = 0;
  auVar20._0_4_ = local_2c8.values.values[2];
  auVar20._4_4_ = local_2c8.values.values[3];
  auVar11._0_8_ = local_2c8.values.values._0_8_;
LAB_003eb9f1:
  local_2c8.values.values = SVar31.values.values;
  local_2b8 = auVar20;
  pstd::optional<pbrt::ShapeIntersection>::~optional(&local_1a0);
  SVar31.values.values[2] = (float)local_2b8._0_4_;
  SVar31.values.values[3] = (float)local_2b8._4_4_;
  SVar31.values.values[0] = (float)auVar11._0_8_;
  SVar31.values.values[1] = SUB84(auVar11._0_8_,4);
  return (SampledSpectrum)SVar31.values.values;
}

Assistant:

SampledSpectrum LiRandomWalk(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 int depth) const {
        SampledSpectrum L(0.f);
        // Intersect ray with scene and return if no intersection
        pstd::optional<ShapeIntersection> si = Intersect(ray);
        if (!si) {
            // Return emitted light from infinite light sources
            for (LightHandle light : infiniteLights)
                L += light.Le(ray, lambda);
            return L;
        }
        SurfaceInteraction &isect = si->intr;

        // Get emitted radiance at surface intersection
        L = isect.Le(-ray.d, lambda);

        // Terminate random walk if maximum depth has been reached
        if (depth == maxDepth)
            return L;

        // Compute BSDF at random walk intersection point
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf)
            return L;

        // Randomly sample direction leaving surface for random walk
        Point2f u = sampler.Get2D();
        Vector3f wi = SampleUniformSphere(u);

        // Evaluate BSDF at surface for sampled direction
        Vector3f wo = -ray.d;
        SampledSpectrum beta =
            bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / (1 / (4 * Pi));
        if (!beta)
            return L;

        // Recursively trace ray to estimate incident radiance at surface
        ray = isect.SpawnRay(wi);
        return L + beta * LiRandomWalk(ray, lambda, sampler, scratchBuffer, depth + 1);
    }